

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_json_purify_len(char *string)

{
  byte bVar1;
  int len;
  int iVar2;
  char *p;
  
  len = 0;
  do {
    bVar1 = *string;
    if (bVar1 < 0xd) {
      if (1 < bVar1 - 9) {
        if (bVar1 == 0) {
          return len;
        }
        goto LAB_00118777;
      }
LAB_0011876c:
      iVar2 = 2;
    }
    else {
      iVar2 = 6;
      if ((bVar1 != 0x5c) && (bVar1 != 0x22)) {
        if (bVar1 == 0xd) goto LAB_0011876c;
LAB_00118777:
        iVar2 = (uint)((char)bVar1 < ' ') * 5 + 1;
      }
    }
    len = len + iVar2;
    string = (char *)((byte *)string + 1);
  } while( true );
}

Assistant:

int
lws_json_purify_len(const char *string)
{
	int len = 0;
	const char *p = string;

	while (*p) {
		if (*p == '\t' || *p == '\n' || *p == '\r') {
			p++;
			len += 2;
			continue;
		}

		if (*p == '\"' || *p == '\\' || *p < 0x20) {
			len += 6;
			p++;
			continue;
		}
		p++;
		len++;
	}

	return len;
}